

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysc_node * lysc_node_child(lysc_node *node)

{
  lysc_node **pplVar1;
  lysc_node *plVar2;
  
  if (node == (lysc_node *)0x0) {
    plVar2 = (lysc_node *)0x0;
  }
  else if ((node->nodetype & 0x300) == 0) {
    pplVar1 = lysc_node_child_p(node);
    if (pplVar1 == (lysc_node **)0x0) {
      plVar2 = (lysc_node *)0x0;
    }
    else {
      plVar2 = *pplVar1;
    }
  }
  else {
    plVar2 = (lysc_node *)&node[1].module;
  }
  return plVar2;
}

Assistant:

lysc_node *
lysc_node_child(const struct lysc_node *node)
{
    struct lysc_node **child;

    if (!node) {
        return NULL;
    }

    if (node->nodetype & (LYS_RPC | LYS_ACTION)) {
        return &((struct lysc_node_action *)node)->input.node;
    } else {
        child = lysc_node_child_p(node);
        if (child) {
            return *child;
        }
    }

    return NULL;
}